

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  Type TVar1;
  ulong uVar2;
  Type TVar3;
  bool bVar4;
  uint in_EAX;
  Result RVar5;
  char *pcVar6;
  Enum EVar7;
  uint8_t mutable_;
  uint32_t type;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  RVar5 = ReadS32Leb128(this,(uint32_t *)((long)&uStack_28 + 4),"field type");
  uVar2 = uStack_28;
  EVar7 = Error;
  if (RVar5.enum_ != Error) {
    TVar3.enum_ = uStack_28._4_4_;
    bVar4 = IsConcreteType(this,uStack_28._4_4_);
    if (bVar4) {
      uStack_28._0_4_ = (uint)(uint3)uStack_28;
      RVar5 = ReadU8(this,(uint8_t *)((long)&uStack_28 + 3),"field mutability");
      EVar7 = Error;
      if (RVar5.enum_ != Error) {
        if (uStack_28._3_1_ < true) {
          (out_value->type).enum_ = TVar3.enum_;
          out_value->mutable_ = uStack_28._3_1_;
          EVar7 = Ok;
        }
        else {
          PrintError(this,"field mutability must be 0 or 1");
        }
      }
    }
    else {
      pcVar6 = "";
      if ((long)uVar2 < 0) {
        pcVar6 = "-";
      }
      TVar1.enum_ = -TVar3.enum_;
      if (Any < TVar3.enum_) {
        TVar1.enum_ = TVar3.enum_;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar6,(ulong)(uint)TVar1.enum_);
    }
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}